

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<unsigned_char,pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>const&(*)(pbrt::ParsedParameter_const&),bool(*)(unsigned_char_const*,pbrt::FileLoc_const*)>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>_ptr_ParsedParameter_ptr
          *getValues,_func_bool_uchar_ptr_FileLoc_ptr *convert)

{
  string *args;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *pPVar3;
  size_t __n;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar1;
  }
  local_48 = __return_storage_ptr__;
  if (sVar2 != 0) {
    lVar11 = 0;
    local_40 = nPerItem;
    local_38 = typeName;
    do {
      pPVar3 = *(ParsedParameter **)((long)paVar8 + lVar11);
      __n = (pPVar3->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((args = &pPVar3->name, __n == 0 ||
           (iVar6 = bcmp((args->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar6 == 0)) &&
          (iVar6 = std::__cxx11::string::compare((char *)pPVar3), iVar6 == 0)))) {
        pvVar7 = (*getValues)(pPVar3);
        local_3c = local_40;
        uVar4 = pvVar7->nStored;
        if (uVar4 == 0) {
          ErrorExit<std::__cxx11::string_const&>(&pPVar3->loc,"No values provided for \"%s\".",args)
          ;
        }
        uVar9 = (ulong)local_40;
        if (uVar4 % uVar9 == 0) {
          pPVar3->lookedUp = true;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (local_48,uVar4 / uVar9,&local_49);
          if (uVar4 < uVar9) {
            return local_48;
          }
          lVar11 = 0;
          uVar10 = 0;
          do {
            bVar5 = (*convert)(pvVar7->ptr + lVar11,&pPVar3->loc);
            lVar11 = lVar11 + uVar9;
            (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10] = bVar5;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar4 / uVar9);
          return local_48;
        }
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&pPVar3->loc,"Number of values provided for \"%s\" not a multiple of %d",args,
                   &local_3c);
      }
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
  }
  (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_48;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}